

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

bool btGjkEpaSolver2::Penetration
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results,bool usemargins)

{
  _ _Var1;
  _ _Var2;
  btVector3 *in_RSI;
  undefined4 *in_R9;
  uint uVar3;
  btVector3 bVar4;
  byte in_stack_00000008;
  U i;
  btVector3 w0;
  _ epa_status;
  EPA epa;
  _ gjk_status;
  GJK gjk;
  tShape shape;
  undefined4 in_stack_ffffffffffffc3ec;
  undefined4 in_stack_ffffffffffffc3f0;
  U in_stack_ffffffffffffc3f4;
  btVector3 *in_stack_ffffffffffffc3f8;
  btVector3 *v2;
  GJK *in_stack_ffffffffffffc400;
  undefined4 in_stack_ffffffffffffc424;
  undefined8 local_3bd4;
  undefined8 local_3bac;
  undefined8 uStack_3ba4;
  undefined8 local_3b9c;
  undefined8 uStack_3b94;
  undefined4 in_stack_ffffffffffffc474;
  undefined1 withmargins;
  tShape *in_stack_ffffffffffffc478;
  undefined4 in_stack_ffffffffffffc480;
  btScalar in_stack_ffffffffffffc484;
  btTransform *in_stack_ffffffffffffc488;
  btScalar in_stack_ffffffffffffc490;
  undefined4 in_stack_ffffffffffffc494;
  uint uVar5;
  btScalar in_stack_ffffffffffffc498;
  btScalar in_stack_ffffffffffffc49c;
  btScalar in_stack_ffffffffffffc4a0;
  btScalar in_stack_ffffffffffffc4a4;
  uint local_3b00;
  uint local_3ae8;
  btVector3 *in_stack_ffffffffffffc540;
  tShape *in_stack_ffffffffffffc548;
  GJK *in_stack_ffffffffffffc550;
  btVector3 *in_stack_ffffffffffffc5e8;
  GJK *in_stack_ffffffffffffc5f0;
  EPA *in_stack_ffffffffffffc5f8;
  
  withmargins = (undefined1)((uint)in_stack_ffffffffffffc474 >> 0x18);
  gjkepa2_impl::MinkowskiDiff::MinkowskiDiff
            ((MinkowskiDiff *)CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0));
  uVar3 = (uint)(in_stack_00000008 & 1);
  gjkepa2_impl::Initialize
            ((btConvexShape *)CONCAT44(in_stack_ffffffffffffc4a4,in_stack_ffffffffffffc4a0),
             (btTransform *)CONCAT44(in_stack_ffffffffffffc49c,in_stack_ffffffffffffc498),
             (btConvexShape *)CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
             in_stack_ffffffffffffc488,
             (sResults *)CONCAT44(in_stack_ffffffffffffc484,in_stack_ffffffffffffc480),
             in_stack_ffffffffffffc478,(bool)withmargins);
  gjkepa2_impl::GJK::GJK(in_stack_ffffffffffffc400);
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0));
  _Var1 = gjkepa2_impl::GJK::Evaluate
                    (in_stack_ffffffffffffc550,in_stack_ffffffffffffc548,in_stack_ffffffffffffc540);
  if (_Var1 == Inside) {
    gjkepa2_impl::EPA::EPA((EPA *)CONCAT44(in_stack_ffffffffffffc424,1));
    operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0));
    _Var2 = gjkepa2_impl::EPA::Evaluate
                      (in_stack_ffffffffffffc5f8,in_stack_ffffffffffffc5f0,in_stack_ffffffffffffc5e8
                      );
    if (_Var2 != Failed) {
      btVector3::btVector3
                ((btVector3 *)&stack0xffffffffffffc4a4,(btScalar *)&stack0xffffffffffffc4a0,
                 (btScalar *)&stack0xffffffffffffc49c,(btScalar *)&stack0xffffffffffffc498);
      for (uVar5 = 0; uVar5 < local_3b00; uVar5 = uVar5 + 1) {
        gjkepa2_impl::MinkowskiDiff::Support
                  (&in_stack_ffffffffffffc400->m_shape,in_stack_ffffffffffffc3f8,
                   in_stack_ffffffffffffc3f4);
        ::operator*((btVector3 *)in_stack_ffffffffffffc400,in_stack_ffffffffffffc3f8->m_floats);
        btVector3::operator+=
                  ((btVector3 *)&stack0xffffffffffffc4a4,(btVector3 *)&stack0xffffffffffffc484);
      }
      *in_R9 = 1;
      v2 = (btVector3 *)&stack0xffffffffffffc4a4;
      bVar4 = btTransform::operator*
                        ((btTransform *)
                         CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffc3ec,uVar3));
      local_3b9c = bVar4.m_floats._0_8_;
      uStack_3b94 = bVar4.m_floats._8_8_;
      *(undefined8 *)(in_R9 + 1) = local_3b9c;
      *(undefined8 *)(in_R9 + 3) = uStack_3b94;
      ::operator*(in_RSI,v2->m_floats);
      operator-(in_RSI,v2);
      bVar4 = btTransform::operator*
                        ((btTransform *)
                         CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffc3ec,uVar3));
      local_3bac = bVar4.m_floats._0_8_;
      uStack_3ba4 = bVar4.m_floats._8_8_;
      *(undefined8 *)(in_R9 + 5) = local_3bac;
      *(undefined8 *)(in_R9 + 7) = uStack_3ba4;
      bVar4 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffc3f4,in_stack_ffffffffffffc3f0));
      local_3bd4 = bVar4.m_floats._8_8_;
      *(long *)(in_R9 + 9) = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_R9 + 0xb) = local_3bd4;
      in_R9[0xd] = local_3ae8 ^ 0x80000000;
      return true;
    }
    *in_R9 = 3;
  }
  else if (_Var1 == Failed) {
    *in_R9 = 2;
  }
  return false;
}

Assistant:

bool	btGjkEpaSolver2::Penetration(	const btConvexShape*	shape0,
									 const btTransform&		wtrs0,
									 const btConvexShape*	shape1,
									 const btTransform&		wtrs1,
									 const btVector3&		guess,
									 sResults&				results,
									 bool					usemargins)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,usemargins);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,-guess);
	switch(gjk_status)
	{
	case	GJK::eStatus::Inside:
		{
			EPA				epa;
			EPA::eStatus::_	epa_status=epa.Evaluate(gjk,-guess);
			if(epa_status!=EPA::eStatus::Failed)
			{
				btVector3	w0=btVector3(0,0,0);
				for(U i=0;i<epa.m_result.rank;++i)
				{
					w0+=shape.Support(epa.m_result.c[i]->d,0)*epa.m_result.p[i];
				}
				results.status			=	sResults::Penetrating;
				results.witnesses[0]	=	wtrs0*w0;
				results.witnesses[1]	=	wtrs0*(w0-epa.m_normal*epa.m_depth);
				results.normal			=	-epa.m_normal;
				results.distance		=	-epa.m_depth;
				return(true);
			} else results.status=sResults::EPA_Failed;
		}
		break;
	case	GJK::eStatus::Failed:
		results.status=sResults::GJK_Failed;
		break;
		default:
					{
					}
	}
	return(false);
}